

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pic.c
# Opt level: O1

void sysbvm_pic_addSelectorTypeAndMethod
               (sysbvm_pic_t *pic,sysbvm_tuple_t selector,sysbvm_tuple_t type,sysbvm_tuple_t method)

{
  uint uVar1;
  atomic_uint aVar2;
  uint uVar3;
  bool bVar4;
  
  do {
    aVar2 = pic->preSequence;
    uVar1 = aVar2 + 1;
    LOCK();
    bVar4 = aVar2 == pic->preSequence;
    if (bVar4) {
      pic->preSequence = uVar1;
    }
    UNLOCK();
  } while (!bVar4);
  uVar3 = uVar1 & 3;
  pic->entries[uVar3].type = type;
  pic->entries[uVar3].selector = selector;
  pic->entries[uVar3].method = method;
  pic->postSequence = uVar1;
  return;
}

Assistant:

SYSBVM_API void sysbvm_pic_addSelectorTypeAndMethod(sysbvm_pic_t *pic, sysbvm_tuple_t selector, sysbvm_tuple_t type, sysbvm_tuple_t method)
{
    unsigned int sequence = sysbvm_pic_writeLock(pic);
    unsigned int entryIndex = sequence % SYSBVM_PIC_ENTRY_COUNT;
    sysbvm_picEntry_t *entry = pic->entries + entryIndex;
    entry->type = type;
    entry->selector = selector;
    entry->method = method;

    sysbvm_pic_writeUnlock(pic, sequence);
}